

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O1

SQInteger __thiscall SQLexer::ReadID(SQLexer *this)

{
  LexChar LVar1;
  byte bVar2;
  SQUnsignedInteger SVar3;
  ulong uVar4;
  int iVar5;
  char *pcVar6;
  SQInteger SVar7;
  SQUnsignedInteger size;
  SQUnsignedInteger SVar8;
  char local_29;
  
  local_29 = '\0';
  sqvector<char>::resize(&this->_longstr,0,&local_29);
  do {
    LVar1 = this->_currdata;
    SVar3 = (this->_longstr)._allocated;
    uVar4 = (this->_longstr)._size;
    if (SVar3 <= uVar4) {
      SVar8 = uVar4 * 2;
      if (SVar8 == 0) {
        SVar8 = 4;
      }
      pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,SVar8);
      (this->_longstr)._vals = pcVar6;
      (this->_longstr)._allocated = SVar8;
    }
    SVar3 = (this->_longstr)._size;
    (this->_longstr)._size = SVar3 + 1;
    (this->_longstr)._vals[SVar3] = LVar1;
    SVar7 = (*this->_readf)(this->_up);
    if (0xff < SVar7) {
      (*this->_errfunc)(this->_errtarget,"Invalid character");
    }
    if (SVar7 == 0) {
      this->_currdata = '\0';
      this->_reached_eof = 1;
    }
    else {
      this->_currdata = (LexChar)SVar7;
    }
    this->_currentcolumn = this->_currentcolumn + 1;
    bVar2 = this->_currdata;
    iVar5 = isalnum((uint)bVar2);
  } while ((bVar2 == 0x5f) || (iVar5 != 0));
  uVar4 = (this->_longstr)._size;
  SVar3 = (this->_longstr)._allocated;
  if (SVar3 <= uVar4) {
    SVar8 = uVar4 * 2;
    size = 4;
    if (SVar8 != 0) {
      size = SVar8;
    }
    pcVar6 = (char *)sq_vm_realloc((this->_longstr)._vals,SVar3,size);
    (this->_longstr)._vals = pcVar6;
    (this->_longstr)._allocated = size;
  }
  SVar3 = (this->_longstr)._size;
  (this->_longstr)._size = SVar3 + 1;
  (this->_longstr)._vals[SVar3] = '\0';
  SVar7 = GetIDType(this,(this->_longstr)._vals,(this->_longstr)._size - 1);
  if ((SVar7 == 0x136) || (SVar7 == 0x102)) {
    this->_svalue = (this->_longstr)._vals;
  }
  return SVar7;
}

Assistant:

SQInteger SQLexer::ReadID()
{
    SQInteger res;
    INIT_TEMP_STRING();
    do {
        APPEND_CHAR(CUR_CHAR);
        NEXT();
    } while(scisalnum(CUR_CHAR) || CUR_CHAR == _SC('_'));
    TERMINATE_BUFFER();
    res = GetIDType(&_longstr[0],_longstr.size() - 1);
    if(res == TK_IDENTIFIER || res == TK_CONSTRUCTOR) {
        _svalue = &_longstr[0];
    }
    return res;
}